

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_19::BinaryReader::ReadOpcode(BinaryReader *this,Opcode *out_value,char *desc)

{
  Result RVar1;
  uint uVar2;
  Enum EVar3;
  Enum EVar4;
  uint local_30;
  byte local_29;
  uint32_t code;
  uint8_t value;
  
  local_29 = 0;
  RVar1 = ReadU8(this,&local_29,"opcode");
  EVar4 = Error;
  if (RVar1.enum_ != Error) {
    uVar2 = (uint)local_29;
    if ((byte)(local_29 + 4) < 3) {
      RVar1 = ReadU32Leb128(this,&local_30,"opcode");
      if (RVar1.enum_ == Error) {
        return (Result)Error;
      }
      if (0xff < local_30) {
        __assert_fail("code < 0x100",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/opcode.h"
                      ,0x6c,"static uint32_t wabt::Opcode::PrefixCode(uint8_t, uint32_t)");
      }
      uVar2 = uVar2 << 8 | local_30;
      EVar3 = WabtOpcodeCodeTable[uVar2];
      if (((local_30 != 0) && (EVar3 == Unreachable)) && (EVar3 = -uVar2, EVar3 < Invalid)) {
LAB_00f41890:
        __assert_fail("result >= Invalid",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/opcode.h"
                      ,0x7e,"static Enum wabt::Opcode::EncodeInvalidOpcode(uint32_t)");
      }
      out_value->enum_ = EVar3;
      if (RVar1.enum_ == Error) {
        return (Result)Error;
      }
    }
    else {
      EVar3 = WabtOpcodeCodeTable[local_29];
      if ((uVar2 != 0 && EVar3 == Unreachable) && (EVar3 = -uVar2, EVar3 < Invalid))
      goto LAB_00f41890;
      out_value->enum_ = EVar3;
    }
    EVar4 = Ok;
  }
  return (Result)EVar4;
}

Assistant:

Result BinaryReader::ReadOpcode(Opcode* out_value, const char* desc) {
  uint8_t value = 0;
  CHECK_RESULT(ReadU8(&value, desc));

  if (Opcode::IsPrefixByte(value)) {
    uint32_t code;
    CHECK_RESULT(ReadU32Leb128(&code, desc));
    *out_value = Opcode::FromCode(value, code);
  } else {
    *out_value = Opcode::FromCode(value);
  }
  return Result::Ok;
}